

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RegexCompile::maxMatchLength(RegexCompile *this,int32_t start,int32_t end)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  int64_t iVar7;
  long lVar8;
  int local_8c;
  int32_t depth;
  int64_t updatedLen;
  int64_t blockLen;
  int32_t maxLoopCount;
  int32_t loopEndLoc;
  int32_t stringLenOp_1;
  int32_t stringLenOp;
  int32_t jmpDest_1;
  int32_t jmpDest;
  undefined1 local_50 [8];
  UVector32 forwardedLength;
  int32_t currentLen;
  int32_t opType;
  int32_t op;
  int32_t loc;
  int32_t end_local;
  int32_t start_local;
  RegexCompile *this_local;
  
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    forwardedLength.elements._0_4_ = 0;
    UVector32::UVector32((UVector32 *)local_50,end + 1,this->fStatus);
    UVector32::setSize((UVector32 *)local_50,end + 1);
    for (opType = start; iVar1 = start, opType <= end; opType = opType + 1) {
      UVector32::setElementAt((UVector32 *)local_50,0,opType);
    }
    while (opType = iVar1, opType <= end) {
      iVar7 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType);
      uVar4 = (uint)iVar7;
      currentLen._3_1_ = (byte)((ulong)iVar7 >> 0x18);
      forwardedLength.elements._4_4_ = (uint)currentLen._3_1_;
      iVar3 = UVector32::elementAti((UVector32 *)local_50,opType);
      if ((int32_t)forwardedLength.elements < iVar3) {
        forwardedLength.elements._0_4_ = UVector32::elementAti((UVector32 *)local_50,opType);
      }
      iVar3 = (int32_t)forwardedLength.elements;
      uVar6 = opType;
      switch(forwardedLength.elements._4_4_) {
      case 0:
      case 2:
      case 5:
      case 7:
      case 8:
      case 9:
      case 0x10:
      case 0x11:
      case 0x14:
      case 0x17:
      case 0x18:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x23:
      case 0x2a:
      case 0x2b:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x35:
      case 0x36:
      case 0x37:
        break;
      case 1:
        forwardedLength.elements._0_4_ = UVector32::elementAti((UVector32 *)local_50,opType + 1);
        break;
      case 3:
        forwardedLength.elements._0_4_ = safeIncrement((int32_t)forwardedLength.elements,1);
        if (0x10000 < (uVar4 & 0xffffff)) {
          forwardedLength.elements._0_4_ = safeIncrement((int32_t)forwardedLength.elements,1);
        }
        break;
      case 4:
        iVar7 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType + 1);
        forwardedLength.elements._0_4_ =
             safeIncrement((int32_t)forwardedLength.elements,(uint)iVar7 & 0xffffff);
        uVar6 = opType + 1;
        break;
      case 6:
        uVar4 = uVar4 & 0xffffff;
        if (opType < (int)uVar4) {
          iVar5 = UVector32::elementAti((UVector32 *)local_50,uVar4);
          if (iVar5 < iVar3) {
            UVector32::setElementAt((UVector32 *)local_50,(int32_t)forwardedLength.elements,uVar4);
          }
        }
        else {
          forwardedLength.elements._0_4_ = 0x7fffffff;
        }
        break;
      case 10:
      case 0xb:
      case 0xc:
      case 0x15:
      case 0x16:
      case 0x1b:
      case 0x27:
      case 0x31:
      case 0x38:
      case 0x39:
      case 0x3a:
        forwardedLength.elements._0_4_ = safeIncrement((int32_t)forwardedLength.elements,2);
        break;
      case 0xd:
      case 0xf:
      case 0x12:
      case 0x24:
        uVar4 = uVar4 & 0xffffff;
        if ((int)uVar4 < opType) {
          forwardedLength.elements._0_4_ = 0x7fffffff;
        }
        else {
          iVar3 = UVector32::elementAti((UVector32 *)local_50,uVar4);
          if (iVar3 < (int32_t)forwardedLength.elements) {
            UVector32::setElementAt((UVector32 *)local_50,(int32_t)forwardedLength.elements,uVar4);
          }
          forwardedLength.elements._0_4_ = 0;
        }
        break;
      default:
        break;
      case 0x13:
      case 0x22:
      case 0x29:
        forwardedLength.elements._0_4_ = 0x7fffffff;
        break;
      case 0x19:
      case 0x1a:
        iVar7 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType + 1);
        uVar6 = (uint)iVar7 & 0xffffff;
        if (uVar6 != opType + 4U) {
          iVar7 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType + 3);
          if ((int)iVar7 == -1) {
            forwardedLength.elements._0_4_ = 0x7fffffff;
            uVar6 = opType;
          }
          else {
            iVar3 = maxMatchLength(this,opType + 4,uVar6 - 1);
            lVar8 = (long)(int32_t)forwardedLength.elements + (long)iVar3 * (long)(int)iVar7;
            if (lVar8 < 0x7fffffff) {
              forwardedLength.elements._0_4_ = (int32_t)lVar8;
            }
            else {
              forwardedLength.elements._0_4_ = 0x7fffffff;
              uVar6 = opType;
            }
          }
        }
        break;
      case 0x1c:
      case 0x1d:
        break;
      case 0x25:
      case 0x26:
        break;
      case 0x28:
        iVar7 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType + 1);
        forwardedLength.elements._0_4_ =
             safeIncrement((int32_t)forwardedLength.elements,(uint)iVar7 & 0xffffff);
        uVar6 = opType + 1;
        break;
      case 0x2c:
        local_8c = 0;
        while( true ) {
          do {
            opType = opType + 1;
            iVar7 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType);
            uVar4 = (uint)iVar7;
            if ((uVar4 >> 0x18 == 0x25) || (uVar4 >> 0x18 == 0x2c)) {
              local_8c = local_8c + 1;
            }
          } while ((uVar4 >> 0x18 != 0x26) && (uVar4 >> 0x18 != 0x30));
          uVar6 = opType;
          if (local_8c == 0) break;
          local_8c = local_8c + -1;
        }
        break;
      case 0x32:
      case 0x33:
      case 0x34:
        forwardedLength.elements._0_4_ = 0x7fffffff;
      }
      opType = uVar6;
      if ((int32_t)forwardedLength.elements == 0x7fffffff) break;
      iVar1 = opType + 1;
    }
    this_local._4_4_ = (int32_t)forwardedLength.elements;
    UVector32::~UVector32((UVector32 *)local_50);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t   RegexCompile::maxMatchLength(int32_t start, int32_t end) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    U_ASSERT(start <= end);
    U_ASSERT(end < fRXPat->fCompiledPat->size());


    int32_t    loc;
    int32_t    op;
    int32_t    opType;
    int32_t    currentLen = 0;
    UVector32  forwardedLength(end+1, *fStatus);
    forwardedLength.setSize(end+1);

    for (loc=start; loc<=end; loc++) {
        forwardedLength.setElementAt(0, loc);
    }

    for (loc = start; loc<=end; loc++) {
        op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
        opType = URX_TYPE(op);

        // The loop is advancing linearly through the pattern.
        // If the op we are now at was the destination of a branch in the pattern,
        // and that path has a longer maximum length than the current accumulated value,
        // replace the current accumulated value.
        if (forwardedLength.elementAti(loc) > currentLen) {
            currentLen = forwardedLength.elementAti(loc);
        }

        switch (opType) {
            // Ops that don't change the total length matched
        case URX_RESERVED_OP:
        case URX_END:
        case URX_STRING_LEN:
        case URX_NOP:
        case URX_START_CAPTURE:
        case URX_END_CAPTURE:
        case URX_BACKSLASH_B:
        case URX_BACKSLASH_BU:
        case URX_BACKSLASH_G:
        case URX_BACKSLASH_Z:
        case URX_CARET:
        case URX_DOLLAR:
        case URX_DOLLAR_M:
        case URX_DOLLAR_D:
        case URX_DOLLAR_MD:
        case URX_RELOC_OPRND:
        case URX_STO_INP_LOC:
        case URX_CARET_M:
        case URX_CARET_M_UNIX:

        case URX_STO_SP:          // Setup for atomic or possessive blocks.  Doesn't change what can match.
        case URX_LD_SP:

        case URX_LB_END:
        case URX_LB_CONT:
        case URX_LBN_CONT:
        case URX_LBN_END:
            break;


            // Ops that increase that cause an unbounded increase in the length
            //   of a matched string, or that increase it a hard to characterize way.
            //   Call the max length unbounded, and stop further checking.
        case URX_BACKREF:         // BackRef.  Must assume that it might be a zero length match
        case URX_BACKREF_I:
        case URX_BACKSLASH_X:   // Grahpeme Cluster.  Minimum is 1, max unbounded.
            currentLen = INT32_MAX;
            break;


            // Ops that match a max of one character (possibly two 16 bit code units.)
            //
        case URX_STATIC_SETREF:
        case URX_STAT_SETREF_N:
        case URX_SETREF:
        case URX_BACKSLASH_D:
        case URX_BACKSLASH_H:
        case URX_BACKSLASH_R:
        case URX_BACKSLASH_V:
        case URX_ONECHAR_I:
        case URX_DOTANY_ALL:
        case URX_DOTANY:
        case URX_DOTANY_UNIX:
            currentLen = safeIncrement(currentLen, 2);
            break;

            // Single literal character.  Increase current max length by one or two,
            //       depending on whether the char is in the supplementary range.
        case URX_ONECHAR:
            currentLen = safeIncrement(currentLen, 1);
            if (URX_VAL(op) > 0x10000) {
                currentLen = safeIncrement(currentLen, 1);
            }
            break;

            // Jumps.
            //
        case URX_JMP:
        case URX_JMPX:
        case URX_JMP_SAV:
        case URX_JMP_SAV_X:
            {
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest < loc) {
                    // Loop of some kind.  Max match length is unbounded.
                    currentLen = INT32_MAX;
                } else {
                    // Forward jump.  Propagate the current min length to the target loc of the jump.
                    if (forwardedLength.elementAti(jmpDest) < currentLen) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                    currentLen = 0;
                }
            }
            break;

        case URX_BACKTRACK:
            // back-tracks are kind of like a branch, except that the max length was
            //   propagated already, by the state save.
            currentLen = forwardedLength.elementAti(loc+1);
            break;


        case URX_STATE_SAVE:
            {
                // State Save, for forward jumps, propagate the current minimum.
                //               of the state save.
                //             For backwards jumps, they create a loop, maximum
                //               match length is unbounded.
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest > loc) {
                    if (currentLen > forwardedLength.elementAti(jmpDest)) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                } else {
                    currentLen = INT32_MAX;
                }
            }
            break;




        case URX_STRING:
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                currentLen = safeIncrement(currentLen, URX_VAL(stringLenOp));
                break;
            }

        case URX_STRING_I:
            // TODO:  This code assumes that any user string that matches will be no longer
            //        than our compiled string, with case insensitive matching.
            //        Our compiled string has been case-folded already.
            //
            //        Any matching user string will have no more code points than our
            //        compiled (folded) string.  Folding may add code points, but
            //        not remove them.
            //
            //        There is a potential problem if a supplemental code point
            //        case-folds to a BMP code point.  In this case our compiled string
            //        could be shorter (in code units) than a matching user string.
            //
            //        At this time (Unicode 6.1) there are no such characters, and this case
            //        is not being handled.  A test, intltest regex/Bug9283, will fail if
            //        any problematic characters are added to Unicode.
            //
            //        If this happens, we can make a set of the BMP chars that the
            //        troublesome supplementals fold to, scan our string, and bump the
            //        currentLen one extra for each that is found.
            //
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                currentLen = safeIncrement(currentLen, URX_VAL(stringLenOp));
            }
            break;

        case URX_CTR_INIT:
        case URX_CTR_INIT_NG:
            // For Loops, recursively call this function on the pattern for the loop body,
            //   then multiply the result by the maximum loop count.
            {
                int32_t  loopEndLoc = URX_VAL(fRXPat->fCompiledPat->elementAti(loc+1));
                if (loopEndLoc == loc+4) {
                    // Loop has an empty body. No affect on max match length.
                    // Continue processing with code after the loop end.
                    loc = loopEndLoc;
                    break;
                }

                int32_t maxLoopCount = static_cast<int32_t>(fRXPat->fCompiledPat->elementAti(loc+3));
                if (maxLoopCount == -1) {
                    // Unbounded Loop. No upper bound on match length.
                    currentLen = INT32_MAX;
                    break;
                }

                U_ASSERT(loopEndLoc >= loc+4);
                int64_t blockLen = maxMatchLength(loc+4, loopEndLoc-1);  // Recursive call.
                int64_t updatedLen = (int64_t)currentLen + blockLen * maxLoopCount; 
                if (updatedLen >= INT32_MAX) {
                    currentLen = INT32_MAX;
                    break;
                }
                currentLen = (int32_t)updatedLen;
                loc = loopEndLoc;
                break;
            }

        case URX_CTR_LOOP:
        case URX_CTR_LOOP_NG:
            // These opcodes will be skipped over by code for URX_CRT_INIT.
            // We shouldn't encounter them here.
            U_ASSERT(FALSE);
            break;

        case URX_LOOP_SR_I:
        case URX_LOOP_DOT_I:
        case URX_LOOP_C:
            // For anything to do with loops, make the match length unbounded.
            currentLen = INT32_MAX;
            break;



        case URX_LA_START:
        case URX_LA_END:
            // Look-ahead.  Just ignore, treat the look-ahead block as if
            // it were normal pattern.  Gives a too-long match length,
            //  but good enough for now.
            break;

            // End of look-ahead ops should always be consumed by the processing at
            //  the URX_LA_START op.
            // U_ASSERT(FALSE);
            // break;

        case URX_LB_START:
            {
                // Look-behind.  Scan forward until the matching look-around end,
                //   without processing the look-behind block.
                int32_t  depth = 0;
                for (;;) {
                    loc++;
                    op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                    if (URX_TYPE(op) == URX_LA_START || URX_TYPE(op) == URX_LB_START) {
                        depth++;
                    }
                    if (URX_TYPE(op) == URX_LA_END || URX_TYPE(op)==URX_LBN_END) {
                        if (depth == 0) {
                            break;
                        }
                        depth--;
                    }
                    U_ASSERT(loc < end);
                }
            }
            break;

        default:
            U_ASSERT(FALSE);
        }


        if (currentLen == INT32_MAX) {
            //  The maximum length is unbounded.
            //  Stop further processing of the pattern.
            break;
        }

    }
    return currentLen;

}